

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitNew(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ByteCodeWriter *pBVar1;
  ushort uVar2;
  uint16 uVar3;
  ParseableFunctionInfo *pPVar4;
  ParseNode *pnode_00;
  code *pcVar5;
  bool bVar6;
  ArgSlot AVar7;
  uint uVar8;
  RegSlot RVar9;
  ParseNodeCall *pPVar10;
  undefined4 *puVar11;
  uint byteCount;
  uint uVar12;
  ProfileId callSiteId;
  FuncInfo *pFVar13;
  BOOL local_64;
  AuxArray<unsigned_int> *pAStack_60;
  BOOL fSideEffectArgs;
  AuxArray<unsigned_int> *spreadIndices;
  ulong local_50;
  uint local_44;
  FuncInfo *local_40;
  ByteCodeGenerator *local_38;
  
  pPVar10 = ParseNode::AsParseNodeCall(pnode);
  local_38 = (ByteCodeGenerator *)(ulong)*(uint *)&pPVar10->argCount;
  uVar12 = *(uint *)&pPVar10->argCount + 1;
  local_64 = 0;
  pPVar10 = ParseNode::AsParseNodeCall(pnode);
  uVar8 = CountArguments(pPVar10->pnodeArgs,&local_64);
  local_50 = (ulong)(uVar12 & 0xffff);
  local_44 = uVar12;
  if (uVar8 != (uVar12 & 0xffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x20d1,"(argCount == tmpCount)",
                       "argCount cannot overflow as max args capped at parser level");
    if (!bVar6) goto LAB_0081ec51;
    *puVar11 = 0;
  }
  ByteCodeGenerator::StartStatement(byteCodeGenerator,pnode);
  FuncInfo::StartRecordingOutArgs(funcInfo,(uint)local_50);
  if (local_64 != 0) {
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    SaveOpndValue(pPVar10->pnodeTarget,funcInfo);
  }
  pPVar10 = ParseNode::AsParseNodeCall(pnode);
  Emit(pPVar10->pnodeTarget,byteCodeGenerator,funcInfo,0,true,false);
  pPVar10 = ParseNode::AsParseNodeCall(pnode);
  if (pPVar10->pnodeArgs == (ParseNodePtr)0x0) {
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnodeTarget);
    local_40 = funcInfo;
    bVar6 = CreateNativeArrays(byteCodeGenerator,funcInfo);
    uVar8 = 0xc4;
    if (bVar6) {
      pPVar10 = ParseNode::AsParseNodeCall(pnode);
      bVar6 = CallTargetIsArray(pPVar10->pnodeTarget);
      uVar8 = (uint)bVar6 * 3 + 0xc4;
    }
    if ((ProfileId)local_38 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x20e7,"(argCount == 1)","argCount == 1");
      if (!bVar6) goto LAB_0081ec51;
      *puVar11 = 0;
    }
    pBVar1 = &byteCodeGenerator->m_writer;
    local_44 = uVar8;
    bVar6 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(pBVar1,(OpCode)uVar8);
    if ((bVar6) && (uVar2 = byteCodeGenerator->m_callSiteId, uVar2 != 0xffff)) {
      byteCodeGenerator->m_callSiteId = uVar2 + 1;
    }
    else {
      uVar2 = byteCodeGenerator->m_callSiteId;
    }
    local_38 = (ByteCodeGenerator *)(ulong)uVar2;
    AVar7 = (ArgSlot)local_50;
    Js::ByteCodeWriter::StartCall(pBVar1,StartCall,AVar7);
    funcInfo = local_40;
    RVar9 = FuncInfo::AcquireLoc(local_40,pnode);
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    Js::ByteCodeWriter::CallI
              (pBVar1,(OpCode)local_44,RVar9,pPVar10->pnodeTarget->location,AVar7,
               (ProfileId)local_38,CallFlags_None);
    goto LAB_0081ec36;
  }
  bVar6 = IsCallOfConstants(pnode);
  if (bVar6) {
    uVar8 = (uint)local_50;
    Js::ByteCodeWriter::StartCall(&byteCodeGenerator->m_writer,StartCall,(ArgSlot)local_50);
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnodeTarget);
    AVar7 = EmitNewObjectOfConstants(pnode,byteCodeGenerator,funcInfo,uVar8);
  }
  else {
    bVar6 = CreateNativeArrays(byteCodeGenerator,funcInfo);
    if (bVar6) {
      pPVar10 = ParseNode::AsParseNodeCall(pnode);
      bVar6 = CallTargetIsArray(pPVar10->pnodeTarget);
      if (!bVar6) goto LAB_0081e8ce;
      pPVar10 = ParseNode::AsParseNodeCall(pnode);
      spreadIndices._4_4_ = (uint)(pPVar10->spreadArgCount != 0) * 2 + 199;
    }
    else {
LAB_0081e8ce:
      pPVar10 = ParseNode::AsParseNodeCall(pnode);
      spreadIndices._4_4_ = 0x160;
      if (pPVar10->spreadArgCount == 0) {
        spreadIndices._4_4_ = 0xc4;
      }
    }
    pBVar1 = &byteCodeGenerator->m_writer;
    bVar6 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(pBVar1,(OpCode)spreadIndices._4_4_);
    if ((bVar6) && (uVar2 = byteCodeGenerator->m_callSiteId, uVar2 != 0xffff)) {
      byteCodeGenerator->m_callSiteId = uVar2 + 1;
    }
    else {
      uVar2 = byteCodeGenerator->m_callSiteId;
    }
    pFVar13 = (FuncInfo *)(ulong)uVar2;
    uVar3 = byteCodeGenerator->m_callSiteId;
    pAStack_60 = (AuxArray<unsigned_int> *)0x0;
    local_38 = byteCodeGenerator;
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    bVar6 = true;
    if ((pPVar10->field_0x24 & 0x10) == 0) {
      pPVar4 = funcInfo->byteCodeFunction;
      local_40 = pFVar13;
      if ((pPVar4->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_0081ec51;
        *puVar11 = 0;
      }
      if ((ParseableFunctionInfo *)
          (((pPVar4->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar6) goto LAB_0081ec51;
        *puVar11 = 0;
      }
      if ((((pPVar4->super_FunctionProxy).functionInfo.ptr)->attributes & (Async|Generator)) == None
         ) {
        bVar6 = false;
        pFVar13 = local_40;
      }
      else {
        pPVar10 = ParseNode::AsParseNodeCall(pnode);
        bVar6 = pPVar10->pnodeArgs != (ParseNodePtr)0x0;
        pFVar13 = local_40;
      }
    }
    callSiteId = (ProfileId)pFVar13;
    local_40 = funcInfo;
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    pnode_00 = pPVar10->pnodeArgs;
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    funcInfo = local_40;
    AVar7 = EmitArgList(pnode_00,0xffffffff,0xffffffff,0,1,local_38,local_40,callSiteId,
                        (ArgSlot)local_50,bVar6,callSiteId != uVar3,pPVar10->spreadArgCount,
                        &stack0xffffffffffffffa0);
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::ReleaseLoc(funcInfo,pPVar10->pnodeTarget);
    pPVar10 = ParseNode::AsParseNodeCall(pnode);
    if (pPVar10->spreadArgCount == 0) {
      RVar9 = FuncInfo::AcquireLoc(funcInfo,pnode);
      pPVar10 = ParseNode::AsParseNodeCall(pnode);
      Js::ByteCodeWriter::CallI
                (pBVar1,(OpCode)spreadIndices._4_4_,RVar9,pPVar10->pnodeTarget->location,AVar7,
                 callSiteId,CallFlags_None);
    }
    else {
      if (pAStack_60 == (AuxArray<unsigned_int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2114,"(spreadIndices != nullptr)","spreadIndices != nullptr");
        if (!bVar6) goto LAB_0081ec51;
        *puVar11 = 0;
      }
      funcInfo = local_40;
      if ((0x3fffffff < pAStack_60->count) ||
         (byteCount = pAStack_60->count * 4 + 4,
         local_38 = (ByteCodeGenerator *)((ulong)pFVar13 & 0xffff), byteCount == 0)) {
        Math::DefaultOverflowPolicy();
      }
      RVar9 = FuncInfo::AcquireLoc(local_40,pnode);
      pPVar10 = ParseNode::AsParseNodeCall(pnode);
      Js::ByteCodeWriter::CallIExtended
                (pBVar1,(OpCode)spreadIndices._4_4_,RVar9,pPVar10->pnodeTarget->location,AVar7,
                 CallIExtended_SpreadArgs,pAStack_60,byteCount,(ProfileId)local_38,CallFlags_None);
    }
  }
  if ((ArgSlot)local_44 != AVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2122,"(argCount == actualArgCount)","argCount == actualArgCount");
    if (!bVar6) {
LAB_0081ec51:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar11 = 0;
  }
LAB_0081ec36:
  FuncInfo::EndRecordingOutArgs(funcInfo,(ArgSlot)local_50);
  return;
}

Assistant:

void EmitNew(ParseNode* pnode, ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo)
{
    Js::ArgSlot argCount = pnode->AsParseNodeCall()->argCount;
    argCount++; // include "this"

    BOOL fSideEffectArgs = FALSE;
    unsigned int tmpCount = CountArguments(pnode->AsParseNodeCall()->pnodeArgs, &fSideEffectArgs);
    AssertOrFailFastMsg(argCount == tmpCount, "argCount cannot overflow as max args capped at parser level");

    byteCodeGenerator->StartStatement(pnode);

    // Start call, allocate out param space
    funcInfo->StartRecordingOutArgs(argCount);

    // Assign the call target operand(s), putting them into expression temps if necessary to protect
    // them from side-effects.
    if (fSideEffectArgs)
    {
        SaveOpndValue(pnode->AsParseNodeCall()->pnodeTarget, funcInfo);
    }

    Emit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo, false, true);

    if (pnode->AsParseNodeCall()->pnodeArgs == nullptr)
    {
        funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);
        Js::OpCode op = (CreateNativeArrays(byteCodeGenerator, funcInfo)
            && CallTargetIsArray(pnode->AsParseNodeCall()->pnodeTarget))
            ? Js::OpCode::NewScObjArray : Js::OpCode::NewScObject;
        Assert(argCount == 1);

        Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(op);
        byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);
        byteCodeGenerator->Writer()->CallI(op, funcInfo->AcquireLoc(pnode),
            pnode->AsParseNodeCall()->pnodeTarget->location, argCount, callSiteId);
    }
    else
    {
        uint32 actualArgCount = 0;

        if (IsCallOfConstants(pnode))
        {
            byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);
            funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);
            actualArgCount = EmitNewObjectOfConstants(pnode, byteCodeGenerator, funcInfo, argCount);
        }
        else
        {
            Js::OpCode op;
            if ((CreateNativeArrays(byteCodeGenerator, funcInfo) && CallTargetIsArray(pnode->AsParseNodeCall()->pnodeTarget)))
            {
                op = pnode->AsParseNodeCall()->spreadArgCount > 0 ? Js::OpCode::NewScObjArraySpread : Js::OpCode::NewScObjArray;
            }
            else
            {
                op = pnode->AsParseNodeCall()->spreadArgCount > 0 ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
            }

            Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(op);

            // Only emit profiled argouts if we're going to profile this call.
            bool emitProfiledArgouts = callSiteId != byteCodeGenerator->GetCurrentCallSiteId();

            Js::AuxArray<uint32> *spreadIndices = nullptr;

            // Emit argouts at end for generators so that we don't need to restore them when bailing in
            bool emitArgOutsAtEnd = pnode->AsParseNodeCall()->hasDestructuring || (funcInfo->byteCodeFunction->IsCoroutine() && pnode->AsParseNodeCall()->pnodeArgs != nullptr);
            actualArgCount = EmitArgList(pnode->AsParseNodeCall()->pnodeArgs, Js::Constants::NoRegister, Js::Constants::NoRegister,
                false, true, byteCodeGenerator, funcInfo, callSiteId, argCount, emitArgOutsAtEnd, emitProfiledArgouts, pnode->AsParseNodeCall()->spreadArgCount, &spreadIndices);

            funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);

            if (pnode->AsParseNodeCall()->spreadArgCount > 0)
            {
                Assert(spreadIndices != nullptr);
                uint spreadExtraAlloc = UInt32Math::Mul(spreadIndices->count, sizeof(uint32));
                uint spreadIndicesSize = UInt32Math::Add(sizeof(*spreadIndices), spreadExtraAlloc);
                byteCodeGenerator->Writer()->CallIExtended(op, funcInfo->AcquireLoc(pnode), pnode->AsParseNodeCall()->pnodeTarget->location,
                    (uint16)actualArgCount, Js::CallIExtended_SpreadArgs,
                    spreadIndices, spreadIndicesSize, callSiteId);
            }
            else
            {
                byteCodeGenerator->Writer()->CallI(op, funcInfo->AcquireLoc(pnode), pnode->AsParseNodeCall()->pnodeTarget->location,
                    (uint16)actualArgCount, callSiteId);
            }
        }

        Assert(argCount == actualArgCount);
    }

    // End call, pop param space
    funcInfo->EndRecordingOutArgs(argCount);
    return;
}